

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluPixelTransfer.cpp
# Opt level: O0

void glu::texSubImage3D(RenderContext *context,deUint32 target,int level,int x,int y,int z,
                       ConstPixelBufferAccess *src)

{
  code *pcVar1;
  int iVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  TextureFormat *pTVar8;
  InternalError *pIVar9;
  TransferFormat TVar10;
  void *pvVar11;
  deUint32 local_68;
  deUint32 dStack_64;
  TransferFormat format;
  int depth;
  int height;
  int width;
  Functions *gl;
  int z_local;
  int y_local;
  int x_local;
  int level_local;
  deUint32 target_local;
  RenderContext *context_local;
  
  iVar2 = (*context->_vptr_RenderContext[3])();
  do {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) {
LAB_00d295b9:
      pIVar9 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar9,(char *)0x0,
                 "src.getRowPitch() == src.getFormat().getPixelSize()*src.getWidth()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
                 ,0x82);
      __cxa_throw(pIVar9,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    iVar4 = tcu::ConstPixelBufferAccess::getRowPitch(src);
    pTVar8 = tcu::ConstPixelBufferAccess::getFormat(src);
    iVar5 = tcu::TextureFormat::getPixelSize(pTVar8);
    iVar6 = tcu::ConstPixelBufferAccess::getWidth(src);
    if (iVar4 != iVar5 * iVar6) goto LAB_00d295b9;
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  while (dVar3 = ::deGetFalse(), dVar3 == 0) {
    iVar4 = tcu::ConstPixelBufferAccess::getSlicePitch(src);
    iVar5 = tcu::ConstPixelBufferAccess::getRowPitch(src);
    iVar6 = tcu::ConstPixelBufferAccess::getHeight(src);
    if (iVar4 != iVar5 * iVar6) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      iVar4 = tcu::ConstPixelBufferAccess::getWidth(src);
      iVar5 = tcu::ConstPixelBufferAccess::getHeight(src);
      iVar6 = tcu::ConstPixelBufferAccess::getDepth(src);
      pTVar8 = tcu::ConstPixelBufferAccess::getFormat(src);
      TVar10 = getTransferFormat(*pTVar8);
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0xff0);
      pTVar8 = tcu::ConstPixelBufferAccess::getFormat(src);
      iVar7 = getTransferAlignment(*pTVar8);
      (*pcVar1)(0xcf5,iVar7);
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x13c0);
      local_68 = TVar10.format;
      dStack_64 = TVar10.dataType;
      pvVar11 = tcu::ConstPixelBufferAccess::getDataPtr(src);
      (*pcVar1)(target,level,x,y,z,iVar4,iVar5,iVar6,local_68,dStack_64,pvVar11);
      return;
    }
  }
  pIVar9 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar9,(char *)0x0,"src.getSlicePitch() == src.getRowPitch()*src.getHeight()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
             ,0x83);
  __cxa_throw(pIVar9,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void texSubImage3D (const RenderContext& context, deUint32 target, int level, int x, int y, int z, const tcu::ConstPixelBufferAccess& src)
{
	const glw::Functions& gl = context.getFunctions();

	TCU_CHECK_INTERNAL(src.getRowPitch() == src.getFormat().getPixelSize()*src.getWidth());
	TCU_CHECK_INTERNAL(src.getSlicePitch() == src.getRowPitch()*src.getHeight());

	int				width		= src.getWidth();
	int				height		= src.getHeight();
	int				depth		= src.getDepth();
	TransferFormat	format		= getTransferFormat(src.getFormat());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, getTransferAlignment(src.getFormat()));
	gl.texSubImage3D(target, level, x, y, z, width, height, depth, format.format, format.dataType, src.getDataPtr());
}